

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

void param_update(void *filename)

{
  int iVar1;
  void *__cancel_arg;
  __pthread_unwind_buf_t *data;
  double dVar2;
  __pthread_unwind_buf_t __cancel_buf;
  stat prev_status;
  stat status;
  __pthread_unwind_buf_t _Stack_1b8;
  stat local_150;
  stat local_c0;
  
  data = &_Stack_1b8;
  yprintf(OUTPUT_LV_INFO,"Parameter updater started. Watching %s\n",filename);
  iVar1 = __sigsetjmp(&_Stack_1b8,0);
  if (iVar1 == 0) {
    __pthread_register_cancel(&_Stack_1b8);
    stat((char *)filename,&local_150);
    do {
      iVar1 = 3;
      do {
        yp_usleep(100000);
        pthread_testcancel();
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      g_param.parameter_applying = 0;
      stat((char *)filename,&local_c0);
      dVar2 = difftime(local_c0.st_mtim.tv_sec,local_150.st_mtim.tv_sec);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        yp_usleep(100000);
        set_param((char *)filename,(char *)0x0);
        if (((undefined1)g_param.option & OPTION_PARAM_CONTROL) == 0) {
          g_param.parameter_applying = 1;
          apply_robot_params();
        }
      }
      memcpy(&local_150,&local_c0,0x90);
    } while( true );
  }
  param_update_loop_cleanup(data);
  __pthread_unwind_next(&_Stack_1b8);
}

Assistant:

void param_update(void* filename)
{
  struct stat prev_status;

  yprintf(OUTPUT_LV_INFO, "Parameter updater started. Watching %s\n", filename);
  pthread_cleanup_push(param_update_loop_cleanup, filename);

  stat(filename, &prev_status);

  while (1)
  {
    int i;
    struct stat status;

    // 0.3秒に一回パラメータファイル更新をチェック
    for (i = 0; i < 3; i++)
    {
      yp_usleep(100000);
      pthread_testcancel();
    }
    g_param.parameter_applying = 0;
    stat(filename, &status);

    if (difftime(status.st_mtime, prev_status.st_mtime) != 0.0)
    {
      yp_usleep(100000);
      set_param(filename, NULL);
      if (!(option(OPTION_PARAM_CONTROL)))
      {
        g_param.parameter_applying = 1;
        apply_robot_params();
      }
    }

    prev_status = status;
  }
  pthread_cleanup_pop(1);
}